

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

Color * __thiscall
Scene::trace(Color *__return_storage_ptr__,Scene *this,Medium *curMed,double weight,Ray *ray)

{
  element_type *peVar1;
  double v;
  int iVar2;
  undefined4 extraout_var;
  double t;
  Color local_88;
  Vector local_68;
  Vector local_48;
  
  level = level + 1;
  Stats::totalRays = Stats::totalRays + 1;
  iVar2 = (*this->_vptr_Scene[2])(this,ray);
  if ((GeometricObject *)CONCAT44(extraout_var,iVar2) == (GeometricObject *)0x0) {
    (*this->_vptr_Scene[3])(&local_88,this,ray);
    __return_storage_ptr__->x = local_88.x;
    __return_storage_ptr__->y = local_88.y;
    __return_storage_ptr__->z = local_88.z;
  }
  else {
    Ray::point(&local_48,ray,30000.0);
    local_68.x = (ray->dir).x;
    local_68.y = (ray->dir).y;
    local_68.z = (ray->dir).z;
    shade(&local_88,this,curMed,weight,&local_48,&local_68,
          (GeometricObject *)CONCAT44(extraout_var,iVar2));
    __return_storage_ptr__->x = local_88.x;
    __return_storage_ptr__->y = local_88.y;
    __return_storage_ptr__->z = local_88.z;
    if (threshold < curMed->beta) {
      v = exp(curMed->beta * -30000.0);
      Vector::operator*=(__return_storage_ptr__,v);
    }
  }
  peVar1 = (this->envFog).super___shared_ptr<Fog,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*(code *)**(undefined8 **)peVar1)(0,peVar1,__return_storage_ptr__);
  }
  level = level + -1;
  return __return_storage_ptr__;
}

Assistant:

Color Scene::trace(Grayzer::Medium& curMed, double weight, Ray& ray)
{
   GeometricObject *obj;
   double t = GEOM_INFINITY;
   Color color;

   level++;
   Stats::raysCast();

   if((obj = intersect(ray,t)) != 0)
   {
      color = shade(curMed, weight, ray.point(t), ray.dir, obj);
      if(curMed.beta > threshold) color *= exp(-t * curMed.beta);
   }
   else
      color = shade_background(ray);
   //
   // added fog
   //
   if (envFog) envFog->shade(color, t);

   level--;
   return color;
}